

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

string * __thiscall
pugi::impl::(anonymous_namespace)::as_utf8_impl_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,wchar_t *str,size_t length)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  size_t size;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [64];
  undefined1 auVar22 [24];
  undefined1 auVar24 [32];
  undefined1 auVar23 [32];
  undefined1 auVar31 [64];
  
  if (str == (wchar_t *)0x0) {
    size = 0;
  }
  else {
    auVar26 = vpbroadcastq_avx512f();
    auVar35 = ZEXT1664((undefined1  [16])0x0);
    uVar17 = 0;
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar25._8_4_ = 0x10000;
    auVar25._0_8_ = 0x1000000010000;
    auVar25._12_4_ = 0x10000;
    auVar25._16_4_ = 0x10000;
    auVar25._20_4_ = 0x10000;
    auVar25._24_4_ = 0x10000;
    auVar25._28_4_ = 0x10000;
    auVar33._8_4_ = 0x80;
    auVar33._0_8_ = 0x8000000080;
    auVar33._12_4_ = 0x80;
    auVar33._16_4_ = 0x80;
    auVar33._20_4_ = 0x80;
    auVar33._24_4_ = 0x80;
    auVar33._28_4_ = 0x80;
    auVar34._8_4_ = 0x800;
    auVar34._0_8_ = 0x80000000800;
    auVar34._12_4_ = 0x800;
    auVar34._16_4_ = 0x800;
    auVar34._20_4_ = 0x800;
    auVar34._24_4_ = 0x800;
    auVar34._28_4_ = 0x800;
    auVar28 = vpbroadcastq_avx512f(ZEXT816(4));
    do {
      auVar29 = vmovdqa64_avx512f(auVar35);
      auVar35 = vpbroadcastq_avx512f();
      auVar35 = vporq_avx512f(auVar35,auVar27);
      uVar15 = vpcmpuq_avx512f(auVar35,auVar26,2);
      auVar23 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(this + uVar17 * 4));
      lVar16 = CONCAT44((uint)((byte)(uVar15 >> 1) & 1) * auVar23._4_4_,
                        (uint)((byte)uVar15 & 1) * auVar23._0_4_);
      auVar21._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar23._8_4_;
      auVar21._0_8_ = lVar16;
      auVar21._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar23._12_4_;
      auVar22._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar23._16_4_;
      auVar22._0_16_ = auVar21;
      auVar22._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar23._20_4_;
      auVar24._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar23._24_4_;
      auVar24._0_24_ = auVar22;
      auVar24._28_4_ = (uint)(byte)(uVar15 >> 7) * auVar23._28_4_;
      uVar14 = vpcmpud_avx512vl(auVar24,auVar25,1);
      uVar19 = vpcmpud_avx512vl(auVar24,auVar33,5);
      uVar19 = uVar15 & uVar14 & uVar19;
      uVar20 = vpcmpud_avx512vl(auVar24,auVar34,5);
      uVar20 = uVar19 & uVar20;
      uVar18 = vpcmpud_avx512vl(auVar24,auVar34,1);
      uVar19 = uVar19 & uVar18;
      uVar18 = vpcmpud_avx512vl(auVar24,auVar33,1);
      uVar18 = uVar15 & uVar14 & uVar18;
      auVar35._8_8_ = 1;
      auVar35._0_8_ = 1;
      auVar35._16_8_ = 1;
      auVar35._24_8_ = 1;
      auVar35._32_8_ = 1;
      auVar35._40_8_ = 1;
      auVar35._48_8_ = 1;
      auVar35._56_8_ = 1;
      auVar35 = vpblendmq_avx512f(auVar28,auVar35);
      bVar1 = (bool)((byte)uVar18 & 1);
      bVar4 = (bool)((byte)(uVar18 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar18 >> 2) & 1);
      bVar8 = (bool)((byte)(uVar18 >> 3) & 1);
      auVar30 = vpbroadcastq_avx512f(ZEXT816(2));
      bVar2 = (bool)((byte)uVar19 & 1);
      bVar5 = (bool)((byte)(uVar19 >> 1) & 1);
      bVar7 = (bool)((byte)(uVar19 >> 2) & 1);
      bVar9 = (bool)((byte)(uVar19 >> 3) & 1);
      bVar10 = (bool)((byte)(uVar19 >> 4) & 1);
      bVar11 = (bool)((byte)(uVar19 >> 5) & 1);
      bVar12 = (bool)((byte)(uVar19 >> 6) & 1);
      auVar31 = vpbroadcastq_avx512f(ZEXT816(3));
      bVar3 = (bool)((byte)uVar20 & 1);
      auVar32._0_8_ =
           (ulong)bVar3 * auVar31._0_8_ |
           (ulong)!bVar3 *
           ((ulong)bVar2 * auVar30._0_8_ |
           (ulong)!bVar2 * ((ulong)bVar1 * auVar35._0_8_ | (ulong)!bVar1 * lVar16));
      bVar1 = (bool)((byte)(uVar20 >> 1) & 1);
      auVar32._8_8_ =
           (ulong)bVar1 * auVar31._8_8_ |
           (ulong)!bVar1 *
           ((ulong)bVar5 * auVar30._8_8_ |
           (ulong)!bVar5 * ((ulong)bVar4 * auVar35._8_8_ | (ulong)!bVar4 * auVar21._8_8_));
      bVar1 = (bool)((byte)(uVar20 >> 2) & 1);
      auVar32._16_8_ =
           (ulong)bVar1 * auVar31._16_8_ |
           (ulong)!bVar1 *
           ((ulong)bVar7 * auVar30._16_8_ |
           (ulong)!bVar7 * ((ulong)bVar6 * auVar35._16_8_ | (ulong)!bVar6 * auVar22._16_8_));
      bVar1 = (bool)((byte)(uVar20 >> 3) & 1);
      auVar32._24_8_ =
           (ulong)bVar1 * auVar31._24_8_ |
           (ulong)!bVar1 *
           ((ulong)bVar9 * auVar30._24_8_ |
           (ulong)!bVar9 * ((ulong)bVar8 * auVar35._24_8_ | (ulong)!bVar8 * auVar24._24_8_));
      bVar1 = (bool)((byte)(uVar20 >> 4) & 1);
      auVar32._32_8_ =
           (ulong)bVar1 * auVar31._32_8_ |
           (ulong)!bVar1 *
           ((ulong)bVar10 * auVar30._32_8_ |
           (ulong)!bVar10 * (ulong)((byte)(uVar18 >> 4) & 1) * auVar35._32_8_);
      bVar1 = (bool)((byte)(uVar20 >> 5) & 1);
      auVar32._40_8_ =
           (ulong)bVar1 * auVar31._40_8_ |
           (ulong)!bVar1 *
           ((ulong)bVar11 * auVar30._40_8_ |
           (ulong)!bVar11 * (ulong)((byte)(uVar18 >> 5) & 1) * auVar35._40_8_);
      bVar1 = (bool)((byte)(uVar20 >> 6) & 1);
      auVar32._48_8_ =
           (ulong)bVar1 * auVar31._48_8_ |
           (ulong)!bVar1 *
           ((ulong)bVar12 * auVar30._48_8_ |
           (ulong)!bVar12 * (ulong)((byte)(uVar18 >> 6) & 1) * auVar35._48_8_);
      auVar32._56_8_ =
           (uVar20 >> 7) * auVar31._56_8_ |
           (ulong)!SUB81(uVar20 >> 7,0) *
           ((uVar19 >> 7) * auVar30._56_8_ |
           (ulong)!SUB81(uVar19 >> 7,0) * (uVar18 >> 7) * auVar35._56_8_);
      auVar35 = vpaddq_avx512f(auVar29,auVar32);
      uVar17 = uVar17 + 8;
    } while (((long)str + 7U & 0xfffffffffffffff8) != uVar17);
    auVar26 = vmovdqa64_avx512f(auVar35);
    bVar1 = (bool)((byte)uVar15 & 1);
    auVar27._0_8_ = (ulong)bVar1 * auVar26._0_8_ | (ulong)!bVar1 * auVar29._0_8_;
    bVar1 = (bool)((byte)(uVar15 >> 1) & 1);
    auVar27._8_8_ = (ulong)bVar1 * auVar26._8_8_ | (ulong)!bVar1 * auVar29._8_8_;
    bVar1 = (bool)((byte)(uVar15 >> 2) & 1);
    auVar27._16_8_ = (ulong)bVar1 * auVar26._16_8_ | (ulong)!bVar1 * auVar29._16_8_;
    bVar1 = (bool)((byte)(uVar15 >> 3) & 1);
    auVar27._24_8_ = (ulong)bVar1 * auVar26._24_8_ | (ulong)!bVar1 * auVar29._24_8_;
    bVar1 = (bool)((byte)(uVar15 >> 4) & 1);
    auVar27._32_8_ = (ulong)bVar1 * auVar26._32_8_ | (ulong)!bVar1 * auVar29._32_8_;
    bVar1 = (bool)((byte)(uVar15 >> 5) & 1);
    auVar27._40_8_ = (ulong)bVar1 * auVar26._40_8_ | (ulong)!bVar1 * auVar29._40_8_;
    bVar1 = (bool)((byte)(uVar15 >> 6) & 1);
    auVar27._48_8_ = (ulong)bVar1 * auVar26._48_8_ | (ulong)!bVar1 * auVar29._48_8_;
    auVar27._56_8_ = (uVar15 >> 7) * auVar26._56_8_ | (ulong)!SUB81(uVar15 >> 7,0) * auVar29._56_8_;
    auVar25 = vextracti64x4_avx512f(auVar27,1);
    auVar26 = vpaddq_avx512f(auVar27,ZEXT3264(auVar25));
    auVar21 = vpaddq_avx(auVar26._0_16_,auVar26._16_16_);
    auVar13 = vpshufd_avx(auVar21,0xee);
    auVar21 = vpaddq_avx(auVar21,auVar13);
    size = auVar21._0_8_;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)size);
  if (size != 0) {
    anon_unknown_0::as_utf8_end
              ((__return_storage_ptr__->_M_dataplus)._M_p,size,(wchar_t *)this,(size_t)str);
  }
  return __return_storage_ptr__;
}

Assistant:

PUGI__FN std::string as_utf8_impl(const wchar_t* str, size_t length)
	{
		// first pass: get length in utf8 characters
		size_t size = as_utf8_begin(str, length);

		// allocate resulting string
		std::string result;
		result.resize(size);

		// second pass: convert to utf8
		if (size > 0) as_utf8_end(&result[0], size, str, length);

		return result;
	}